

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doubling-factor-counter.cpp
# Opt level: O1

DoublingFactorReport * __thiscall
mahjong::DoubligFactorCounter::report
          (DoublingFactorReport *__return_storage_ptr__,DoubligFactorCounter *this)

{
  _Rb_tree_header *p_Var1;
  int iVar2;
  DoublingFactorTable t;
  PatternComputer c;
  DoublingFactorTable DStack_108;
  PatternComputer local_c8;
  
  (__return_storage_ptr__->wining_hand).tiles.
  super__Vector_base<mahjong::Tile,_std::allocator<mahjong::Tile>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->wining_hand).tiles.
  super__Vector_base<mahjong::Tile,_std::allocator<mahjong::Tile>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (__return_storage_ptr__->wining_hand).tiles.
  super__Vector_base<mahjong::Tile,_std::allocator<mahjong::Tile>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (__return_storage_ptr__->wining_hand).melds.
  super__Vector_base<mahjong::Meld,_std::allocator<mahjong::Meld>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (__return_storage_ptr__->wining_hand).melds.
  super__Vector_base<mahjong::Meld,_std::allocator<mahjong::Meld>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->wining_hand).pairs.
  super__Vector_base<mahjong::Pair,_std::allocator<mahjong::Pair>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->wining_hand).melds.
  super__Vector_base<mahjong::Meld,_std::allocator<mahjong::Meld>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (__return_storage_ptr__->wining_hand).pairs.
  super__Vector_base<mahjong::Pair,_std::allocator<mahjong::Pair>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (__return_storage_ptr__->wining_hand).pairs.
  super__Vector_base<mahjong::Pair,_std::allocator<mahjong::Pair>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  p_Var1 = &(__return_storage_ptr__->patterns)._M_t._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->patterns)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->patterns)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (__return_storage_ptr__->patterns)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->patterns)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->patterns)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  __return_storage_ptr__->bonus_tile_count = 0;
  __return_storage_ptr__->doubling_factor = 0;
  PatternComputer::PatternComputer(&local_c8,this->hand,this->state);
  PatternComputer::compute
            (&local_c8,&__return_storage_ptr__->patterns,&__return_storage_ptr__->wining_hand);
  iVar2 = PlayerHand::bonusTileCount(this->hand,this->state);
  __return_storage_ptr__->bonus_tile_count = iVar2;
  DoublingFactorTable::DoublingFactorTable(&DStack_108,this->hand,this->state);
  iVar2 = DoublingFactorTable::total(&DStack_108,&__return_storage_ptr__->patterns);
  __return_storage_ptr__->doubling_factor = iVar2 + __return_storage_ptr__->bonus_tile_count;
  std::
  _Rb_tree<mahjong::Pattern,_std::pair<const_mahjong::Pattern,_int>,_std::_Select1st<std::pair<const_mahjong::Pattern,_int>_>,_std::less<mahjong::Pattern>,_std::allocator<std::pair<const_mahjong::Pattern,_int>_>_>
  ::~_Rb_tree(&DStack_108.factor_table._M_t);
  PatternComputer::~PatternComputer(&local_c8);
  return __return_storage_ptr__;
}

Assistant:

DoublingFactorReport DoubligFactorCounter::report()
{
	DoublingFactorReport r;

	PatternComputer c(hand, state);
	c.compute(r.patterns, r.wining_hand);

	r.bonus_tile_count = hand.bonusTileCount(state);

	DoublingFactorTable t(hand, state);
	r.doubling_factor = t.total(r.patterns);
	r.doubling_factor += r.bonus_tile_count;

	return r;
}